

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

void __thiscall
lsim::gui::CircuitEditor::CircuitEditor(CircuitEditor *this,ModelCircuit *model_circuit)

{
  ModelCircuit *model_circuit_local;
  CircuitEditor *this_local;
  
  this->m_model_circuit = model_circuit;
  std::
  vector<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
  ::vector(&this->m_widgets);
  std::
  unordered_map<lsim::Point,_unsigned_long,_lsim::gui::CircuitEditor::PointHash,_std::equal_to<lsim::Point>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>_>
  ::unordered_map(&this->m_point_pin_lut);
  std::
  vector<lsim::gui::CircuitEditor::SelectedItem,_std::allocator<lsim::gui::CircuitEditor::SelectedItem>_>
  ::vector(&this->m_selection);
  Point::Point(&this->m_area_sel_a);
  std::
  vector<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::allocator<std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>
  ::vector(&this->m_copy_components);
  Point::Point(&this->m_copy_center);
  this->m_state = CS_IDLE;
  this->m_hovered_widget = (ComponentWidget *)0x0;
  this->m_hovered_pin = 0xffffffffffffffff;
  this->m_hovered_wire = (ModelWire *)0x0;
  Point::Point(&this->m_scroll_delta,0.0,0.0);
  Point::Point(&this->m_screen_offset);
  Point::Point(&this->m_mouse_grid_point);
  Point::Point(&this->m_dragging_last_point);
  WireEndPoint::WireEndPoint(&this->m_wire_start);
  WireEndPoint::WireEndPoint(&this->m_wire_end);
  Point::Point(&this->m_segment_start);
  std::vector<lsim::Point,_std::allocator<lsim::Point>_>::vector(&this->m_line_anchors);
  this->m_sim_circuit = (SimCircuit *)0x0;
  this->m_view_only = false;
  this->m_popup_component = (ComponentWidget *)0x0;
  this->m_show_grid = true;
  return;
}

Assistant:

CircuitEditor::CircuitEditor(ModelCircuit *model_circuit) : 
			m_model_circuit(model_circuit),
			m_sim_circuit(nullptr),
			m_view_only(false),
			m_show_grid(true),
			m_scroll_delta(0,0),
			m_state(CS_IDLE),
			m_hovered_pin(PIN_ID_INVALID),
			m_hovered_widget(nullptr),
			m_hovered_wire(nullptr),
			m_popup_component(nullptr) {
}